

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeSelect
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,vector<wasm::Type,_std::allocator<wasm::Type>_> *res)

{
  _Storage<wasm::Type,_true> *p_Var1;
  _Storage<wasm::Type,_true> *p_Var2;
  undefined4 in_register_00000014;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> *this_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_c0;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_98;
  Err local_70;
  string local_50;
  allocator<char> local_29;
  
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._4_4_ = in_register_00000014;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_4_ = pos;
  if (res != (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x0) {
    p_Var1 = (_Storage<wasm::Type,_true> *)
             (res->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    p_Var2 = (_Storage<wasm::Type,_true> *)
             (res->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (p_Var2 != p_Var1) {
      if (8 < (ulong)((long)p_Var2 - (long)p_Var1)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"select may not have more than one result type",&local_29);
        Lexer::err(&local_70,&this->in,(ulong)pos,&local_50);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        return __return_storage_ptr__;
      }
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = *p_Var1;
      IRBuilder::makeSelect((Result<wasm::Ok> *)&local_c0,&this->irBuilder,type_00);
      withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_c0);
      this_00 = &local_c0;
      goto LAB_00c7ef29;
    }
  }
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  IRBuilder::makeSelect((Result<wasm::Ok> *)&local_98,&this->irBuilder,type);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_98);
  this_00 = &local_98;
LAB_00c7ef29:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage(this_00)
  ;
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSelect(Index pos,
                      const std::vector<Annotation>& annotations,
                      std::vector<Type>* res) {
    if (res && res->size()) {
      if (res->size() > 1) {
        return in.err(pos, "select may not have more than one result type");
      }
      return withLoc(pos, irBuilder.makeSelect((*res)[0]));
    }
    return withLoc(pos, irBuilder.makeSelect());
  }